

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mrg5s.hpp
# Opt level: O2

void __thiscall trng::mrg5s::backward(mrg5s *this)

{
  undefined8 uVar1;
  int32_t iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  
  iVar5 = (this->P).a[4];
  if (iVar5 == 0) {
    iVar5 = (this->P).a[3];
    if (iVar5 == 0) {
      iVar5 = (this->P).a[2];
      if (iVar5 != 0) {
        iVar3 = (this->S).r[1] - (int)(((long)(this->S).r[2] * (long)(this->P).a[0]) % 0x7fffa78f);
        iVar6 = iVar3 + 0x7fffa78f;
        if (-1 < iVar3) {
          iVar6 = iVar3;
        }
        iVar6 = iVar6 - (int)(((long)(this->S).r[3] * (long)(this->P).a[1]) % 0x7fffa78f);
        goto LAB_00109f6f;
      }
      iVar5 = (this->P).a[1];
      if (iVar5 == 0) {
        iVar2 = (this->P).a[0];
        if (iVar2 == 0) {
          iVar5 = 0;
        }
        else {
          iVar5 = (this->S).r[3];
          iVar2 = int_math::modulo_inverse(iVar2,0x7fffa78f);
          iVar5 = (int)(((long)iVar2 * (long)iVar5) % 0x7fffa78f);
        }
        goto LAB_00109fff;
      }
      iVar6 = (this->S).r[2] - (int)(((long)(this->S).r[3] * (long)(this->P).a[0]) % 0x7fffa78f);
      iVar3 = iVar6 + 0x7fffa78f;
      if (-1 < iVar6) {
        iVar3 = iVar6;
      }
    }
    else {
      iVar3 = (this->S).r[0] - (int)(((long)(this->S).r[1] * (long)(this->P).a[0]) % 0x7fffa78f);
      iVar6 = iVar3 + 0x7fffa78f;
      if (-1 < iVar3) {
        iVar6 = iVar3;
      }
      iVar6 = iVar6 - (int)(((long)(this->S).r[2] * (long)(this->P).a[1]) % 0x7fffa78f);
      iVar4 = iVar6 + 0x7fffa78f;
      if (-1 < iVar6) {
        iVar4 = iVar6;
      }
      iVar4 = iVar4 - (int)(((long)(this->S).r[3] * (long)(this->P).a[2]) % 0x7fffa78f);
      iVar3 = iVar4 + 0x7fffa78f;
      if (-1 < iVar4) {
        iVar3 = iVar4;
      }
    }
  }
  else {
    iVar3 = (this->S).r[0] - (int)(((long)(this->S).r[1] * (long)(this->P).a[0]) % 0x7fffa78f);
    iVar6 = iVar3 + 0x7fffa78f;
    if (-1 < iVar3) {
      iVar6 = iVar3;
    }
    iVar6 = iVar6 - (int)(((long)(this->S).r[2] * (long)(this->P).a[1]) % 0x7fffa78f);
    iVar3 = iVar6 + 0x7fffa78f;
    if (-1 < iVar6) {
      iVar3 = iVar6;
    }
    iVar3 = iVar3 - (int)(((long)(this->S).r[3] * (long)(this->P).a[2]) % 0x7fffa78f);
    iVar6 = iVar3 + 0x7fffa78f;
    if (-1 < iVar3) {
      iVar6 = iVar3;
    }
    iVar6 = iVar6 - (int)(((long)(this->S).r[4] * (long)(this->P).a[3]) % 0x7fffa78f);
LAB_00109f6f:
    iVar3 = iVar6 + 0x7fffa78f;
    if (-1 < iVar6) {
      iVar3 = iVar6;
    }
  }
  iVar2 = int_math::modulo_inverse(iVar5,0x7fffa78f);
  iVar5 = (int)(((long)iVar2 * (long)iVar3) % 0x7fffa78f);
LAB_00109fff:
  uVar1 = *(undefined8 *)((this->S).r + 3);
  *(undefined8 *)(this->S).r = *(undefined8 *)((this->S).r + 1);
  *(undefined8 *)((this->S).r + 2) = uVar1;
  (this->S).r[4] = iVar5;
  return;
}

Assistant:

TRNG_CUDA_ENABLE
  inline void mrg5s::backward() {
    result_type t;
    if (P.a[4] != 0) {
      t = S.r[0];
      t -= static_cast<result_type>(
          (static_cast<int64_t>(P.a[0]) * static_cast<int64_t>(S.r[1])) % modulus);
      if (t < 0)
        t += modulus;
      t -= static_cast<result_type>(
          (static_cast<int64_t>(P.a[1]) * static_cast<int64_t>(S.r[2])) % modulus);
      if (t < 0)
        t += modulus;
      t -= static_cast<result_type>(
          (static_cast<int64_t>(P.a[2]) * static_cast<int64_t>(S.r[3])) % modulus);
      if (t < 0)
        t += modulus;
      t -= static_cast<result_type>(
          (static_cast<int64_t>(P.a[3]) * static_cast<int64_t>(S.r[4])) % modulus);
      if (t < 0)
        t += modulus;
      t = static_cast<result_type>(
          (static_cast<int64_t>(t) *
           static_cast<int64_t>(int_math::modulo_inverse(P.a[4], modulus))) %
          modulus);
    } else if (P.a[3] != 0) {
      t = S.r[0];
      t -= static_cast<result_type>(
          (static_cast<int64_t>(P.a[0]) * static_cast<int64_t>(S.r[1])) % modulus);
      if (t < 0)
        t += modulus;
      t -= static_cast<result_type>(
          (static_cast<int64_t>(P.a[1]) * static_cast<int64_t>(S.r[2])) % modulus);
      if (t < 0)
        t += modulus;
      t -= static_cast<result_type>(
          (static_cast<int64_t>(P.a[2]) * static_cast<int64_t>(S.r[3])) % modulus);
      if (t < 0)
        t += modulus;
      t = static_cast<result_type>(
          (static_cast<int64_t>(t) *
           static_cast<int64_t>(int_math::modulo_inverse(P.a[3], modulus))) %
          modulus);
    } else if (P.a[2] != 0) {
      t = S.r[1];
      t -= static_cast<result_type>(
          (static_cast<int64_t>(P.a[0]) * static_cast<int64_t>(S.r[2])) % modulus);
      if (t < 0)
        t += modulus;
      t -= static_cast<result_type>(
          (static_cast<int64_t>(P.a[1]) * static_cast<int64_t>(S.r[3])) % modulus);
      if (t < 0)
        t += modulus;
      t = static_cast<result_type>(
          (static_cast<int64_t>(t) *
           static_cast<int64_t>(int_math::modulo_inverse(P.a[2], modulus))) %
          modulus);
    } else if (P.a[1] != 0) {
      t = S.r[2];
      t -= static_cast<result_type>(
          (static_cast<int64_t>(P.a[0]) * static_cast<int64_t>(S.r[3])) % modulus);
      if (t < 0)
        t += modulus;
      t = static_cast<result_type>(
          (static_cast<int64_t>(t) *
           static_cast<int64_t>(int_math::modulo_inverse(P.a[1], modulus))) %
          modulus);
    } else if (P.a[0] != 0) {
      t = S.r[3];
      t = static_cast<result_type>(
          (static_cast<int64_t>(t) *
           static_cast<int64_t>(int_math::modulo_inverse(P.a[0], modulus))) %
          modulus);
    } else
      t = 0;
    S.r[0] = S.r[1];
    S.r[1] = S.r[2];
    S.r[2] = S.r[3];
    S.r[3] = S.r[4];
    S.r[4] = t;
  }